

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::PrettyUnitTestResultPrinter::PrintFailedTests(UnitTest *unit_test)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  TestCase *this;
  char *pcVar5;
  TestInfo *test_info;
  int j;
  TestCase *test_case;
  int i;
  int failed_test_count;
  char *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  TestInfo *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int local_10;
  
  iVar2 = UnitTest::failed_test_count((UnitTest *)0x174f33);
  if (iVar2 != 0) {
    local_10 = 0;
    while (iVar2 = local_10, iVar3 = UnitTest::total_test_case_count((UnitTest *)0x174f5d),
          iVar2 < iVar3) {
      this = UnitTest::GetTestCase
                       ((UnitTest *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                        (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
      bVar1 = TestCase::should_run(this);
      if ((bVar1) && (iVar3 = TestCase::failed_test_count((TestCase *)0x174f98), iVar3 != 0)) {
        in_stack_ffffffffffffffd0 = 0;
        while (iVar3 = in_stack_ffffffffffffffd0,
              iVar4 = TestCase::total_test_count((TestCase *)0x174fbc),
              in_stack_ffffffffffffffd0 < iVar4) {
          in_stack_ffffffffffffffd8 =
               TestCase::GetTestInfo
                         ((TestCase *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
                          (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
          bVar1 = TestInfo::should_run(in_stack_ffffffffffffffd8);
          if (bVar1) {
            TestInfo::result(in_stack_ffffffffffffffd8);
            bVar1 = TestResult::Passed((TestResult *)0x174fff);
            if (!bVar1) {
              ColoredPrintf(COLOR_RED,"[  FAILED  ] ");
              in_stack_ffffffffffffffc8 = TestCase::name((TestCase *)0x175024);
              pcVar5 = TestInfo::name((TestInfo *)0x175032);
              printf("%s.%s",in_stack_ffffffffffffffc8,pcVar5);
              PrintFullTestCommentIfPresent((TestInfo *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
              printf("\n");
            }
          }
          in_stack_ffffffffffffffd0 = iVar3 + 1;
        }
      }
      local_10 = local_10 + 1;
    }
  }
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::PrintFailedTests(const UnitTest& unit_test) {
  const int failed_test_count = unit_test.failed_test_count();
  if (failed_test_count == 0) {
    return;
  }

  for (int i = 0; i < unit_test.total_test_case_count(); ++i) {
    const TestCase& test_case = *unit_test.GetTestCase(i);
    if (!test_case.should_run() || (test_case.failed_test_count() == 0)) {
      continue;
    }
    for (int j = 0; j < test_case.total_test_count(); ++j) {
      const TestInfo& test_info = *test_case.GetTestInfo(j);
      if (!test_info.should_run() || test_info.result()->Passed()) {
        continue;
      }
      ColoredPrintf(COLOR_RED, "[  FAILED  ] ");
      printf("%s.%s", test_case.name(), test_info.name());
      PrintFullTestCommentIfPresent(test_info);
      printf("\n");
    }
  }
}